

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pam.c
# Opt level: O0

int pam_write_file(pam_t *pam,char *outpath)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  char *pcStack_30;
  int len;
  char *tupl;
  FILE *f;
  char *outpath_local;
  pam_t *pam_local;
  
  __stream = fopen(outpath,"w+");
  if (__stream == (FILE *)0x0) {
    pam_local._4_4_ = -1;
  }
  else {
    switch(pam->type) {
    case 5000:
      pcStack_30 = "GRAYSCALE_ALPHA";
      break;
    case 0x1389:
      pcStack_30 = "RGB_ALPHA";
      break;
    case 0x138a:
      pcStack_30 = "RGB";
      break;
    case 0x138b:
      pcStack_30 = "GRAYSCALE";
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pam.c"
                    ,0xb3,"int pam_write_file(pam_t *, const char *)");
    }
    fprintf(__stream,"P7\nWIDTH %d\nHEIGHT %d\nDEPTH %d\nMAXVAL %d\nTUPLTYPE %s\nENDHDR\n",
            (ulong)(uint)pam->width,(ulong)(uint)pam->height,(ulong)(uint)pam->depth,
            (ulong)(uint)pam->maxval,pcStack_30);
    iVar1 = pam->width * pam->height * pam->depth;
    sVar2 = fwrite(pam->data,1,(long)iVar1,__stream);
    if ((long)iVar1 == sVar2) {
      fclose(__stream);
      pam_local._4_4_ = 0;
    }
    else {
      fclose(__stream);
      pam_local._4_4_ = -2;
    }
  }
  return pam_local._4_4_;
}

Assistant:

int pam_write_file(pam_t *pam, const char *outpath)
{
    FILE *f = fopen(outpath, "w+");
    if (!f)
        return -1;

    const char *tupl = NULL;
    switch (pam->type) {
        case PAM_GRAYSCALE_ALPHA:
            tupl = "GRAYSCALE_ALPHA";
            break;
        case PAM_RGB_ALPHA:
            tupl = "RGB_ALPHA";
            break;
        case PAM_RGB:
            tupl = "RGB";
            break;
        case PAM_GRAYSCALE:
            tupl = "GRAYSCALE";
            break;
        default:
            assert(0);
    }

    fprintf(f, "P7\nWIDTH %d\nHEIGHT %d\nDEPTH %d\nMAXVAL %d\nTUPLTYPE %s\nENDHDR\n",
            pam->width, pam->height, pam->depth, pam->maxval, tupl);
    int len = pam->width * pam->height * pam->depth;
    if (len != fwrite(pam->data, 1, len, f)) {
        fclose(f);
        return -2;
    }

    fclose(f);

    return 0;
}